

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LexerTests.cpp
# Opt level: O3

void checkTimeLiteral(string *s,TimeUnit flagCheck,double num)

{
  undefined1 *puVar1;
  NumericTokenFlags NVar2;
  SourceManager *sourceManager;
  Token TVar3;
  StringRef macroName;
  StringRef macroName_00;
  StringRef macroName_01;
  StringRef macroName_02;
  StringRef macroName_03;
  string_view text;
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  StringRef capturedExpression_01;
  StringRef capturedExpression_02;
  AssertionHandler catchAssertionHandler;
  Token token;
  undefined1 local_f1 [60];
  char local_b5;
  long *local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  ReusableStringStream local_88;
  undefined1 local_78 [32];
  size_type local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  Token local_40;
  
  text._M_str = (s->_M_dataplus)._M_p;
  text._M_len = s->_M_string_length;
  local_f1[0] = flagCheck;
  local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)num;
  TVar3 = lexToken(text,Default);
  local_78._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/tests/unittests/parsing/LexerTests.cpp"
  ;
  local_78._8_8_ = 0x2cc;
  macroName.m_size = 5;
  macroName.m_start = "CHECK";
  capturedExpression.m_size = 0x24;
  capturedExpression.m_start = "token.kind == TokenKind::TimeLiteral";
  local_40 = TVar3;
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)(local_f1 + 1),macroName,(SourceLineInfo *)local_78,
             capturedExpression,ContinueOnFailure);
  local_50 = &local_a8;
  local_78[9] = TVar3.kind == TimeLiteral;
  local_78[8] = true;
  local_a8._M_dataplus._M_p._0_1_ = 9;
  local_a8._M_dataplus._M_p._1_1_ = 0;
  local_78._0_8_ = &PTR_streamReconstructedExpression_00c8af40;
  local_78._24_8_ = (long)"!==" + 1;
  local_58 = 2;
  local_78._16_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_40;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)(local_f1 + 1),(ITransientExpression *)local_78);
  Catch::AssertionHandler::complete((AssertionHandler *)(local_f1 + 1));
  if (local_b5 == '\0') {
    (**(code **)(*local_b0 + 0xa0))();
  }
  local_78._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/tests/unittests/parsing/LexerTests.cpp"
  ;
  local_78._8_8_ = 0x2cd;
  macroName_00.m_size = 5;
  macroName_00.m_start = "CHECK";
  capturedExpression_00.m_size = 0x15;
  capturedExpression_00.m_start = "token.toString() == s";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)(local_f1 + 1),macroName_00,(SourceLineInfo *)local_78,
             capturedExpression_00,ContinueOnFailure);
  slang::parsing::Token::toString_abi_cxx11_(&local_a8,&local_40);
  local_88.m_index = (size_t)&local_a8;
  Catch::operator==((enable_if_t<Detail::conjunction<Detail::is_eq_comparable<const_basic_string<char,_char_traits<char>,_allocator<char>_>_&,_const_basic_string<char,_char_traits<char>,_allocator<char>_>_&>,_Detail::negation<capture_by_value<Detail::RemoveCVRef_t<const_basic_string<char,_char_traits<char>,_allocator<char>_>_&>_>_>_>::value,_BinaryExpr<const_basic_string<char,_char_traits<char>,_allocator<char>_>_&,_const_basic_string<char,_char_traits<char>,_allocator<char>_>_&>_>
                     *)local_78,
                    (ExprLhs<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                     *)&local_88,s);
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)(local_f1 + 1),(ITransientExpression *)local_78);
  puVar1 = (undefined1 *)
           CONCAT62(local_a8._M_dataplus._M_p._2_6_,
                    CONCAT11(local_a8._M_dataplus._M_p._1_1_,(TimeUnit)local_a8._M_dataplus._M_p));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar1 != &local_a8.field_2) {
    operator_delete(puVar1,local_a8.field_2._M_allocated_capacity + 1);
  }
  Catch::AssertionHandler::complete((AssertionHandler *)(local_f1 + 1));
  if (local_b5 == '\0') {
    (**(code **)(*local_b0 + 0xa0))();
  }
  local_78._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/tests/unittests/parsing/LexerTests.cpp"
  ;
  local_78._8_8_ = 0x2ce;
  macroName_01.m_size = 5;
  macroName_01.m_start = "CHECK";
  capturedExpression_01.m_size = 0x28;
  capturedExpression_01.m_start = "token.numericFlags().unit() == flagCheck";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)(local_f1 + 1),macroName_01,(SourceLineInfo *)local_78,
             capturedExpression_01,ContinueOnFailure);
  NVar2 = slang::parsing::Token::numericFlags(&local_40);
  local_a8._M_dataplus._M_p._0_1_ = NVar2.raw >> 3 & (Picoseconds|Nanoseconds);
  local_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f1;
  local_78[9] = (TimeUnit)local_a8._M_dataplus._M_p == local_f1[0];
  local_78[8] = true;
  local_78._0_8_ = &PTR_streamReconstructedExpression_00c8bb28;
  local_78._24_8_ = (long)"!==" + 1;
  local_58 = 2;
  local_78._16_8_ = &local_a8;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)(local_f1 + 1),(ITransientExpression *)local_78);
  Catch::AssertionHandler::complete((AssertionHandler *)(local_f1 + 1));
  if (local_b5 == '\0') {
    (**(code **)(*local_b0 + 0xa0))();
  }
  local_78._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/tests/unittests/parsing/LexerTests.cpp"
  ;
  local_78._8_8_ = 0x2cf;
  macroName_02.m_size = 5;
  macroName_02.m_start = "CHECK";
  capturedExpression_02.m_size = 0x18;
  capturedExpression_02.m_start = "token.realValue() == num";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)(local_f1 + 1),macroName_02,(SourceLineInfo *)local_78,
             capturedExpression_02,ContinueOnFailure);
  local_78._16_8_ = slang::parsing::Token::realValue(&local_40);
  local_78[9] = (double)local_78._16_8_ == (double)local_48;
  local_78[8] = true;
  local_78._0_8_ = &PTR_streamReconstructedExpression_00c8bb58;
  local_78._24_8_ = (long)"!==" + 1;
  local_58 = 2;
  local_50 = local_48;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)(local_f1 + 1),(ITransientExpression *)local_78);
  Catch::AssertionHandler::complete((AssertionHandler *)(local_f1 + 1));
  if (local_b5 == '\0') {
    (**(code **)(*local_b0 + 0xa0))();
  }
  sourceManager = getSourceManager();
  slang::Diagnostics::sort((Diagnostics *)&slang::diagnostics,sourceManager);
  if (DAT_00cb2828 != 0) {
    local_78._0_8_ =
         "/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/tests/unittests/parsing/LexerTests.cpp"
    ;
    local_78._8_8_ = 0x2d0;
    macroName_03.m_size = 10;
    macroName_03.m_start = "FAIL_CHECK";
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)(local_f1 + 1),macroName_03,(SourceLineInfo *)local_78,
               (StringRef)ZEXT816(0x9db414),ContinueOnFailure);
    local_88.m_index = 0;
    local_88.m_oss = (ostream *)0x0;
    Catch::ReusableStringStream::ReusableStringStream(&local_88);
    reportGlobalDiags_abi_cxx11_();
    std::__ostream_insert<char,std::char_traits<char>>
              (local_88.m_oss,
               (char *)CONCAT62(local_a8._M_dataplus._M_p._2_6_,
                                CONCAT11(local_a8._M_dataplus._M_p._1_1_,
                                         (TimeUnit)local_a8._M_dataplus._M_p)),
               local_a8._M_string_length);
    Catch::ReusableStringStream::str_abi_cxx11_((string *)local_78,&local_88);
    Catch::AssertionHandler::handleMessage
              ((AssertionHandler *)(local_f1 + 1),ExplicitFailure,(string *)local_78);
    if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
      operator_delete((void *)local_78._0_8_,(size_t)(local_78._16_8_ + 1));
    }
    puVar1 = (undefined1 *)
             CONCAT62(local_a8._M_dataplus._M_p._2_6_,
                      CONCAT11(local_a8._M_dataplus._M_p._1_1_,(TimeUnit)local_a8._M_dataplus._M_p))
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar1 != &local_a8.field_2) {
      operator_delete(puVar1,local_a8.field_2._M_allocated_capacity + 1);
    }
    Catch::ReusableStringStream::~ReusableStringStream(&local_88);
    Catch::AssertionHandler::complete((AssertionHandler *)(local_f1 + 1));
    if (local_b5 == '\0') {
      (**(code **)(*local_b0 + 0xa0))();
    }
  }
  return;
}

Assistant:

void checkTimeLiteral(const std::string& s, TimeUnit flagCheck, double num) {
    Token token = lexToken(s);

    CHECK(token.kind == TokenKind::TimeLiteral);
    CHECK(token.toString() == s);
    CHECK(token.numericFlags().unit() == flagCheck);
    CHECK(token.realValue() == num);
    CHECK_DIAGNOSTICS_EMPTY;
}